

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.hpp
# Opt level: O0

void __thiscall deqp::ub::StructType::~StructType(StructType *this)

{
  StructType *this_local;
  
  std::vector<deqp::ub::StructMember,_std::allocator<deqp::ub::StructMember>_>::~vector
            (&this->m_members);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~StructType(void)
	{
	}